

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O2

ScpServer * scp_recognise_exec(SshChannel *sc,SftpServerVtable *sftpserver_vt,ptrlen command)

{
  ptrlen whole;
  ptrlen whole_00;
  ptrlen whole_01;
  ptrlen whole_02;
  ptrlen whole_03;
  ptrlen pVar1;
  ptrlen whole_04;
  ptrlen pathname;
  ptrlen pathname_00;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  uint uVar7;
  ScpSink *scp;
  SftpServer *pSVar8;
  strbuf *psVar9;
  ScpSource *scp_00;
  ScpError *pSVar10;
  _Bool _Var11;
  ScpServer *pSVar13;
  char *fmt;
  ptrlen prefix;
  ptrlen prefix_00;
  ptrlen prefix_01;
  ptrlen prefix_02;
  ptrlen prefix_03;
  ptrlen prefix_04;
  ptrlen prefix_05;
  ptrlen command_local;
  _Bool _Var12;
  
  prefix.len = 4;
  prefix.ptr = "scp ";
  command_local.ptr = command.ptr;
  command_local.len = command.len;
  _Var5 = ptrlen_startswith(command,prefix,&command_local);
  if (_Var5) {
    _Var5 = false;
    bVar3 = false;
    _Var4 = false;
    do {
      do {
        do {
          do {
            _Var12 = _Var4;
            bVar2 = bVar3;
            _Var11 = _Var5;
            whole.len = command_local.len;
            whole.ptr = command_local.ptr;
            prefix_00.len = 3;
            prefix_00.ptr = "-v ";
            _Var6 = ptrlen_startswith(whole,prefix_00,&command_local);
            _Var5 = _Var11;
            bVar3 = bVar2;
            _Var4 = _Var12;
          } while (_Var6);
          whole_00.len = command_local.len;
          whole_00.ptr = command_local.ptr;
          prefix_01.len = 3;
          prefix_01.ptr = "-r ";
          _Var6 = ptrlen_startswith(whole_00,prefix_01,&command_local);
          _Var4 = true;
        } while (_Var6);
        whole_01.len = command_local.len;
        whole_01.ptr = command_local.ptr;
        prefix_02.len = 3;
        prefix_02.ptr = "-p ";
        _Var6 = ptrlen_startswith(whole_01,prefix_02,&command_local);
        _Var5 = true;
        _Var4 = _Var12;
      } while (_Var6);
      whole_02.len = command_local.len;
      whole_02.ptr = command_local.ptr;
      prefix_03.len = 3;
      prefix_03.ptr = "-d ";
      _Var6 = ptrlen_startswith(whole_02,prefix_03,&command_local);
      _Var5 = _Var11;
      bVar3 = true;
    } while (_Var6);
    whole_03.len = command_local.len;
    whole_03.ptr = command_local.ptr;
    prefix_04.len = 3;
    prefix_04.ptr = "-t ";
    _Var5 = ptrlen_startswith(whole_03,prefix_04,&command_local);
    pathname.len = command_local.len;
    pathname.ptr = command_local.ptr;
    whole_04.len = command_local.len;
    whole_04.ptr = command_local.ptr;
    pVar1.len = command_local.len;
    pVar1.ptr = command_local.ptr;
    if (_Var5) {
      scp = (ScpSink *)safemalloc(1,0x168,0);
      memset(scp,0,0xe0);
      (scp->scpserver).vt = &ScpSink_ScpServer_vt;
      (scp->reply).err = false;
      *(undefined3 *)&(scp->reply).field_0x1 = 0;
      (scp->reply).code = 0;
      (scp->reply).errmsg = (char *)0x0;
      (scp->reply).attrs.flags = 0;
      (scp->reply).attrs.size = 0;
      (scp->reply).attrs.uid = 0;
      (scp->reply).attrs.gid = 0;
      (scp->reply).attrs.permissions = 0;
      (scp->reply).attrs.atime = 0;
      (scp->reply).attrs.mtime = 0;
      (scp->reply).name.ptr = (void *)0x0;
      (scp->reply).name.len = 0;
      (scp->reply).handle.ptr = (void *)0x0;
      (scp->reply).data.len = 0;
      (scp->reply).handle.len = 0;
      (scp->reply).data.ptr = (void *)0x0;
      (scp->reply).srb.vt = &ScpReplyReceiver_vt;
      scp->sc = sc;
      pSVar8 = (*sftpserver_vt->new)(sftpserver_vt);
      scp->sf = pSVar8;
      bufchain_init(&scp->data);
      psVar9 = strbuf_new();
      scp->command = psVar9;
      psVar9 = strbuf_new();
      scp->filename_sb = psVar9;
      _Var5 = true;
      if (!bVar2) {
        (*scp->sf->vt->stat)(scp->sf,&(scp->reply).srb,pVar1,true);
        if (((scp->reply).err == false) && (((scp->reply).attrs.flags & 4) != 0)) {
          _Var5 = (_Bool)((*(byte *)((long)&(scp->reply).attrs.permissions + 1) & 0x40) >> 6);
        }
        else {
          _Var5 = false;
        }
      }
      pSVar13 = &scp->scpserver;
      scp_sink_push(scp,pathname,_Var5);
      queue_toplevel_callback(scp_sink_start_callback,scp);
    }
    else {
      prefix_05.len = 3;
      prefix_05.ptr = "-f ";
      fmt = (char *)command_local.len;
      _Var5 = ptrlen_startswith(whole_04,prefix_05,&command_local);
      if (_Var5) {
        pathname_00.len = command_local.len;
        pathname_00.ptr = command_local.ptr;
        scp_00 = (ScpSource *)safemalloc(1,0xe0,0);
        scp_00->sc = (SshChannel *)0x0;
        scp_00->head = (ScpSourceStackEntry *)0x0;
        scp_00->sf = (SftpServer *)0x0;
        scp_00->acks = 0;
        scp_00->expect_newline = false;
        scp_00->eof = false;
        scp_00->throttled = false;
        scp_00->finished = false;
        scp_00->recursive = false;
        scp_00->send_file_times = false;
        *(undefined6 *)&scp_00->field_0x22 = 0;
        scp_00->pending_commands[0] = (strbuf *)0x0;
        scp_00->pending_commands[1] = (strbuf *)0x0;
        scp_00->pending_commands[2] = (strbuf *)0x0;
        *(undefined8 *)&scp_00->n_pending_commands = 0;
        scp_00->file_offset = 0;
        scp_00->file_size = 0;
        pSVar13 = &scp_00->scpserver;
        (scp_00->scpserver).vt = &ScpSource_ScpServer_vt;
        (scp_00->reply).err = false;
        *(undefined3 *)&(scp_00->reply).field_0x1 = 0;
        (scp_00->reply).code = 0;
        (scp_00->reply).errmsg = (char *)0x0;
        (scp_00->reply).attrs.flags = 0;
        (scp_00->reply).attrs.size = 0;
        (scp_00->reply).attrs.uid = 0;
        (scp_00->reply).attrs.gid = 0;
        (scp_00->reply).attrs.permissions = 0;
        (scp_00->reply).attrs.atime = 0;
        (scp_00->reply).attrs.mtime = 0;
        (scp_00->reply).name.ptr = (void *)0x0;
        (scp_00->reply).name.len = 0;
        (scp_00->reply).handle.ptr = (void *)0x0;
        (scp_00->reply).data.len = 0;
        (scp_00->reply).handle.len = 0;
        (scp_00->reply).data.ptr = (void *)0x0;
        (scp_00->reply).srb.vt = &ScpReplyReceiver_vt;
        scp_00->sc = sc;
        pSVar8 = (*sftpserver_vt->new)(sftpserver_vt);
        scp_00->sf = pSVar8;
        scp_00->n_pending_commands = 0;
        scp_source_push(scp_00,SCP_ROOTPATH,pathname_00,(ptrlen)ZEXT816(0x16ff63),(fxp_attrs *)0x0,
                        (char *)0x0);
        scp_00->recursive = _Var12;
        scp_00->send_file_times = _Var11;
      }
      else {
        uVar7 = string_length_for_printf(command.len);
        pSVar10 = scp_error_new(sc,fmt,(ulong)uVar7,command.ptr);
        pSVar13 = &pSVar10->scpserver;
      }
    }
  }
  else {
    pSVar13 = (ScpServer *)0x0;
  }
  return pSVar13;
}

Assistant:

ScpServer *scp_recognise_exec(
    SshChannel *sc, const SftpServerVtable *sftpserver_vt, ptrlen command)
{
    bool recursive = false, preserve = false;
    bool targetshouldbedirectory = false;
    ptrlen command_orig = command;

    if (!ptrlen_startswith(command, PTRLEN_LITERAL("scp "), &command))
        return NULL;

    while (1) {
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-v "), &command)) {
            /* Enable verbose mode in the server, which we ignore */
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-r "), &command)) {
            recursive = true;
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-p "), &command)) {
            preserve = true;
            continue;
        }
        if (ptrlen_startswith(command, PTRLEN_LITERAL("-d "), &command)) {
            targetshouldbedirectory = true;
            continue;
        }
        break;
    }

    if (ptrlen_startswith(command, PTRLEN_LITERAL("-t "), &command)) {
        ScpSink *scp = scp_sink_new(sc, sftpserver_vt, command,
                                    targetshouldbedirectory);
        return &scp->scpserver;
    } else if (ptrlen_startswith(command, PTRLEN_LITERAL("-f "), &command)) {
        ScpSource *scp = scp_source_new(sc, sftpserver_vt, command);
        scp->recursive = recursive;
        scp->send_file_times = preserve;
        return &scp->scpserver;
    } else {
        ScpError *scp = scp_error_new(
            sc, "Unable to parse scp command: '%.*s'",
            PTRLEN_PRINTF(command_orig));
        return &scp->scpserver;
    }
}